

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrogram.cpp
# Opt level: O1

int __thiscall
ncnn::Spectrogram::forward(Spectrogram *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  void *pvVar5;
  double dVar6;
  uint uVar7;
  uint _c;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint _h;
  void *pvVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float local_140;
  float local_13c;
  Mat local_138;
  ulong local_e8;
  ulong local_e0;
  long local_d8;
  ulong local_d0;
  float *local_c8;
  ulong local_c0;
  size_t local_b8;
  void *local_b0;
  void *local_a8;
  size_t local_a0;
  size_t local_98;
  long local_90;
  double local_88;
  double local_80;
  Option opt_b;
  
  local_138.data = bottom_blob->data;
  piVar3 = bottom_blob->refcount;
  local_138.refcount._0_4_ = SUB84(piVar3,0);
  local_138.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
  local_138.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_138.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_138.elempack = bottom_blob->elempack;
  local_138.allocator = bottom_blob->allocator;
  local_138.dims = bottom_blob->dims;
  local_138.w = bottom_blob->w;
  local_138.h = bottom_blob->h;
  local_138.d = bottom_blob->d;
  local_138.c = bottom_blob->c;
  local_138.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (this->center == 1) {
    opt_b.lightmode = opt->lightmode;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_ops = opt->use_subgroup_ops;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.vulkan_device_index = opt->vulkan_device_index;
    opt_b.use_reserved_1 = opt->use_reserved_1;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_2 = opt->use_reserved_2;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_b.use_fp16_uniform = opt->use_fp16_uniform;
    opt_b.use_int8_uniform = opt->use_int8_uniform;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    if (this->pad_type == 0) {
      iVar14 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_138,0,0,iVar14,iVar14,0,0.0,&opt_b);
    }
    if (this->pad_type == 1) {
      iVar14 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_138,0,0,iVar14,iVar14,1,0.0,&opt_b);
    }
    if (this->pad_type == 2) {
      iVar14 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_138,0,0,iVar14,iVar14,2,0.0,&opt_b);
    }
  }
  uVar1 = this->n_fft;
  iVar14 = (int)(local_138.w - uVar1) / this->hoplen;
  _h = iVar14 + 1;
  uVar16 = (ulong)_h;
  local_c0 = (ulong)(uint)((int)uVar1 / 2);
  uVar7 = (int)uVar1 / 2 + 1;
  _c = uVar7;
  if (this->onesided == 0) {
    _c = uVar1;
  }
  if (this->power == 0) {
    Mat::create(top_blob,2,_h,_c,CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize),
                opt->blob_allocator);
  }
  else {
    Mat::create(top_blob,_h,_c,CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize),
                opt->blob_allocator);
  }
  iVar11 = -100;
  if ((top_blob->data != (void *)0x0) &&
     (local_e8 = uVar16, (long)top_blob->c * top_blob->cstep != 0)) {
    if (-2 < (int)uVar1) {
      uVar1 = this->n_fft;
      iVar11 = this->normalized;
      if (iVar11 == 1) {
        fVar20 = (float)(1.0 / SQRT((double)(int)uVar1));
      }
      else {
        fVar20 = 1.0;
      }
      local_a8 = local_138.data;
      iVar2 = this->power;
      local_b0 = top_blob->data;
      local_b8 = top_blob->elemsize;
      local_98 = (size_t)top_blob->w;
      local_a0 = top_blob->cstep;
      local_90 = (long)(int)uVar1;
      dVar21 = 1.0 / (double)(int)uVar1;
      local_d8 = (long)this->hoplen << 2;
      uVar16 = 0;
      local_88 = dVar21;
      do {
        sVar4 = local_a0;
        if (iVar2 != 0) {
          sVar4 = local_98;
        }
        local_e0 = uVar16;
        if (-1 < iVar14) {
          pfVar12 = (float *)(sVar4 * uVar16 * local_b8 + (long)local_b0);
          local_e0._0_4_ = (int)uVar16;
          pvVar5 = (this->window_data).data;
          dVar6 = (double)(int)local_e0 * 6.283185307179586;
          uVar16 = 0;
          pvVar18 = local_a8;
          local_80 = dVar6;
          do {
            local_d0 = uVar16;
            local_c8 = pfVar12;
            if ((int)uVar1 < 1) {
              fVar23 = 0.0;
              fVar22 = 0.0;
            }
            else {
              fVar22 = 0.0;
              uVar16 = 0;
              fVar23 = 0.0;
              do {
                fVar19 = *(float *)((long)pvVar5 + uVar16 * 4) *
                         *(float *)((long)pvVar18 + uVar16 * 4);
                sincosf((float)((double)(int)uVar16 * dVar6 * dVar21),&local_13c,&local_140);
                fVar23 = fVar23 + local_140 * fVar19;
                fVar22 = fVar22 - fVar19 * local_13c;
                uVar16 = uVar16 + 1;
                dVar21 = local_88;
                dVar6 = local_80;
              } while (uVar1 != uVar16);
            }
            fVar23 = fVar23 * fVar20;
            fVar22 = fVar22 * fVar20;
            if (iVar11 == 2) {
              fVar19 = *(float *)((long)pvVar5 + local_90 * 4);
              fVar23 = fVar23 * fVar19;
              fVar22 = fVar22 * fVar19;
            }
            pfVar12 = local_c8;
            if (iVar2 == 0) {
              *local_c8 = fVar23;
              local_c8[1] = fVar22;
              pfVar12 = local_c8 + 2;
            }
            if (iVar2 == 1) {
              *pfVar12 = SQRT(fVar22 * fVar22 + fVar23 * fVar23);
              pfVar12 = pfVar12 + 1;
            }
            if (iVar2 == 2) {
              *pfVar12 = fVar22 * fVar22 + fVar23 * fVar23;
              pfVar12 = pfVar12 + 1;
            }
            uVar16 = (ulong)((int)local_d0 + 1);
            pvVar18 = (void *)((long)pvVar18 + local_d8);
          } while ((int)local_d0 != iVar14);
        }
        uVar16 = local_e0 + 1;
      } while (uVar16 != uVar7);
    }
    iVar11 = 0;
    if ((this->onesided == 0) &&
       (uVar16 = (ulong)(uint)this->n_fft, iVar11 = 0, (int)uVar7 < this->n_fft)) {
      lVar15 = (long)(int)local_e8;
      lVar10 = (long)(int)uVar7;
      uVar17 = ~(long)(int)local_c0;
      do {
        if (this->power == 0) {
          if (-1 < iVar14) {
            pvVar5 = top_blob->data;
            lVar8 = top_blob->cstep * top_blob->elemsize;
            lVar13 = ((long)(int)uVar16 + uVar17) * lVar8;
            lVar8 = lVar8 * lVar10;
            lVar9 = 0;
            do {
              *(undefined4 *)((long)pvVar5 + lVar9 * 8 + lVar8) =
                   *(undefined4 *)((long)pvVar5 + lVar9 * 8 + lVar13);
              *(uint *)((long)pvVar5 + lVar9 * 8 + lVar8 + 4) =
                   *(uint *)((long)pvVar5 + lVar9 * 8 + lVar13 + 4) ^ 0x80000000;
              lVar9 = lVar9 + 1;
            } while ((int)local_e8 != (int)lVar9);
          }
        }
        else {
          lVar13 = (long)top_blob->w * top_blob->elemsize;
          memcpy((void *)(lVar13 * lVar10 + (long)top_blob->data),
                 (void *)(((int)uVar16 - lVar10) * lVar13 + (long)top_blob->data),lVar15 << 2);
        }
        lVar10 = lVar10 + 1;
        uVar16 = (ulong)this->n_fft;
        uVar17 = uVar17 - 1;
      } while (lVar10 < (long)uVar16);
      iVar11 = 0;
    }
  }
  piVar3 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        if (local_138.data != (void *)0x0) {
          free(local_138.data);
        }
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int Spectrogram::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // https://pytorch.org/audio/stable/generated/torchaudio.functional.spectrogram.html

    // TODO custom window

    Mat bottom_blob_bordered = bottom_blob;
    if (center == 1)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        if (pad_type == 0)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_CONSTANT, 0.f, opt_b);
        if (pad_type == 1)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_REPLICATE, 0.f, opt_b);
        if (pad_type == 2)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_REFLECT, 0.f, opt_b);
    }

    const int size = bottom_blob_bordered.w;

    // const int frames = size / hoplen + 1;
    const int frames = (size - n_fft) / hoplen + 1;
    const int freqs_onesided = n_fft / 2 + 1;
    const int freqs = onesided ? freqs_onesided : n_fft;

    const size_t elemsize = bottom_blob_bordered.elemsize;

    if (power == 0)
    {
        top_blob.create(2, frames, freqs, elemsize, opt.blob_allocator);
    }
    else
    {
        top_blob.create(frames, freqs, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < freqs_onesided; i++)
    {
        const float* ptr = bottom_blob_bordered;
        float* outptr = power == 0 ? top_blob.channel(i) : top_blob.row(i);

        for (int j = 0; j < frames; j++)
        {
            float re = 0.f;
            float im = 0.f;
            for (int k = 0; k < n_fft; k++)
            {
                float v = ptr[k];

                // apply window
                v *= window_data[k];

                // dft
                double angle = 2 * 3.14159265358979323846 * i * k / n_fft;

                re += v * cosf(angle); // + imag * sinf(angle);
                im -= v * sinf(angle); // + imag * cosf(angle);
            }

            if (normalized == 1)
            {
                float norm = 1.f / sqrt(n_fft);
                re *= norm;
                im *= norm;
            }
            if (normalized == 2)
            {
                float norm = window_data[n_fft];
                re *= norm;
                im *= norm;
            }

            if (power == 0)
            {
                // complex as real
                outptr[0] = re;
                outptr[1] = im;
                outptr += 2;
            }
            if (power == 1)
            {
                // magnitude
                outptr[0] = sqrt(re * re + im * im);
                outptr += 1;
            }
            if (power == 2)
            {
                outptr[0] = re * re + im * im;
                outptr += 1;
            }

            ptr += hoplen;
        }
    }

    if (!onesided)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = freqs_onesided; i < n_fft; i++)
        {
            if (power == 0)
            {
                const float* ptr = top_blob.channel(n_fft - i);
                float* outptr = top_blob.channel(i);

                for (int j = 0; j < frames; j++)
                {
                    // complex as real
                    outptr[0] = ptr[0];
                    outptr[1] = -ptr[1];
                    ptr += 2;
                    outptr += 2;
                }
            }
            else // if (power == 1 || power == 2)
            {
                const float* ptr = top_blob.row(n_fft - i);
                float* outptr = top_blob.row(i);

                memcpy(outptr, ptr, frames * sizeof(float));
            }
        }
    }

    return 0;
}